

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.h
# Opt level: O1

Worker * lace_steal(WorkerP *self,Task *__dq_head,Worker *victim)

{
  anon_struct_8_2_24e63f91_for_ts aVar1;
  Task *pTVar2;
  Worker *in_RAX;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  
  if ((victim != (Worker *)0x0) && (victim->allstolen == '\0')) {
    aVar1 = (victim->ts).ts;
    uVar3 = aVar1.tail;
    if (uVar3 < aVar1.split) {
      LOCK();
      bVar5 = aVar1 == (anon_struct_8_2_24e63f91_for_ts)(victim->ts).v;
      if (bVar5) {
        (victim->ts).v = (ulong)(uVar3 + 1) | (ulong)aVar1 & 0xffffffff00000000;
      }
      UNLOCK();
      in_RAX = (Worker *)0x1;
      if (bVar5) {
        pTVar2 = victim->dq;
        uVar4 = (ulong)aVar1 & 0xffffffff;
        pTVar2[uVar4].thief = self->_public;
        (*pTVar2[uVar4].f)(self,__dq_head,pTVar2 + uVar4);
        pTVar2[uVar4].thief = (_Worker *)0x2;
        in_RAX = (Worker *)0x0;
      }
    }
    else if (victim->movesplit == '\0') {
      victim->movesplit = '\x01';
    }
    if (uVar3 < aVar1.split) {
      return in_RAX;
    }
  }
  return (Worker *)0x2;
}

Assistant:

lace_steal(WorkerP *self, Task *__dq_head, Worker *victim)
{
    if (victim != NULL && !victim->allstolen) {
        TailSplitNA ts;
        ts.v = victim->ts.v;
        if (ts.ts.tail < ts.ts.split) {
            TailSplitNA ts_new;
            ts_new.v = ts.v;
            ts_new.ts.tail++;
            if (atomic_compare_exchange_weak(&victim->ts.v, &ts.v, ts_new.v)) {
                // Stolen
                Task *t = &victim->dq[ts.ts.tail];
                atomic_store_explicit(&t->thief, self->_public, memory_order_relaxed);
                lace_time_event(self, 1);
                t->f(self, __dq_head, t);
                lace_time_event(self, 2);
                atomic_store_explicit(&t->thief, THIEF_COMPLETED, memory_order_release);
                lace_time_event(self, 8);
                return LACE_STOLEN;
            }

            lace_time_event(self, 7);
            return LACE_BUSY;
        }

        if (victim->movesplit == 0) {
            victim->movesplit = 1;
            PR_COUNTSPLITS(self, CTR_split_req);
        }
    }

    lace_time_event(self, 7);
    return LACE_NOWORK;
}